

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall util_tests::test_tracked_vector::test_method(test_tracked_vector *this)

{
  long lVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  iterator __end0;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  iterator __begin0;
  pointer pTVar8;
  iterator __begin0_1;
  pointer pTVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  check_type cVar10;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  char *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  undefined1 *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  undefined1 *local_9d8;
  undefined1 *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  local_938;
  undefined1 *local_918;
  undefined1 *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  local_7b8;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 local_6a4 [8];
  uint uStack_69c;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  local_678;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v6;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  local_4e8;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v5;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v4;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v3;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v2;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v1;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 local_e0 [8];
  assertion_result local_d8;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *local_c0;
  undefined1 local_b8 [8];
  lazy_ostream local_b0;
  undefined1 *local_a0;
  lazy_ostream *local_98;
  undefined1 local_90 [16];
  assertion_result local_80;
  Tracker t3;
  Tracker t2;
  Tracker t1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  t1.copies = 0;
  t2.origin = &t2;
  t2.copies = 0;
  t3.origin = &t3;
  t3.copies = 0;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74ddf6;
  file.m_end = (iterator)0x5f8;
  file.m_begin = (iterator)&local_f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  t1.origin = &t1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_100,msg);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "t1.origin == &t1";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_108 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(t1.origin == &t1);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_110,0x5f8);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74deba;
  file_00.m_end = (iterator)0x5f9;
  file_00.m_begin = (iterator)&local_120;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
             msg_00);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(t2.origin == &t2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "t2.origin == &t2";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_138 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_140,0x5f9);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74df86;
  file_01.m_end = (iterator)0x5fa;
  file_01.m_begin = (iterator)&local_150;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_160,
             msg_01);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(t3.origin == &t3);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "t3.origin == &t3";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_168 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_170,0x5fa);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(&v1,1);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker&>
            ((vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
              *)&v1,&t1);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5fd;
  file_02.m_begin = (iterator)&local_198;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a8,
             msg_02);
  pTVar8 = v1.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)v1.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)v1.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&v5;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&v6;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)v1.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)v1.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x10);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v6.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_98 = (lazy_ostream *)&v3;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &v4;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf7359d,(size_t)&v2,0x5fd,&local_b0,
             "1U",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74e1fc;
  file_03.m_end = (iterator)0x5fe;
  file_03.m_begin = (iterator)&local_1d8;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e8,
             msg_03);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar8->origin == &t1);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v1[0].origin == &t1";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_1f8,0x5fe);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5ff;
  file_04.m_begin = (iterator)&local_208;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_218,
             msg_04);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&(v1.
                  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  ._M_impl.super__Vector_impl_data._M_start)->copies;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v5.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((v1.
         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         ._M_impl.super__Vector_impl_data._M_start)->copies == 1);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)&v3;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&v5;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = &v4;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf735bb,(size_t)&v2,0x5ff,&local_b0,
             "1",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(&v2,1);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker>(&v2,&t2);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x602;
  file_05.m_begin = (iterator)&local_248;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_258,
             msg_05);
  pTVar8 = v2.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)v2.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)v2.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_90;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)v2.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)v2.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x10);
  local_90._0_4_ = 1;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_empty = false;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&v6;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)&v4;
  local_d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = &v5;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf735c8,(size_t)&v3,0x602,&local_b0,
             "1U",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74e5da;
  file_06.m_end = (iterator)0x603;
  file_06.m_begin = (iterator)&local_268;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_278,
             msg_06);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar8->origin == &t2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v2[0].origin == &t2";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_280 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_288,0x603);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x604;
  file_07.m_begin = (iterator)&local_298;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2a8,
             msg_07);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)v6.
                        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((v2.
         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         ._M_impl.super__Vector_impl_data._M_start)->copies == 0);
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&(v2.
                  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  ._M_impl.super__Vector_impl_data._M_start)->copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)&v4;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&v6;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = &v5;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf735e6,(size_t)&v3,0x604,&local_b0,
             "0",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(&v3,2);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker&>
            ((vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
              *)&v3,&t1);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker>(&v3,&t2);
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x607;
  file_08.m_begin = (iterator)&local_2d8;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2e8,
             msg_08);
  pTVar8 = v3.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_90._0_8_ =
       (long)v3.
             super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)v3.
             super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)v3.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)v3.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20);
  local_b8._0_4_ = 2;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_empty = false;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_90;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)&v5;
  local_d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = &v6;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf735f3,(size_t)&v4,0x607,&local_b0,
             "2U",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74e9c8;
  file_09.m_end = (iterator)0x608;
  file_09.m_begin = (iterator)&local_2f8;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_308,
             msg_09);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v3[0].origin == &t1";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_310 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar8->origin == &t1);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_318,0x608);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74ea9a;
  file_10.m_end = (iterator)0x609;
  file_10.m_begin = (iterator)&local_328;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_338,
             msg_10);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar8[1].origin == &t2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v3[1].origin == &t2";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_340 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_348,0x609);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x60a;
  file_11.m_begin = (iterator)&local_358;
  msg_11.m_end = pvVar7;
  msg_11.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_368,
             msg_11);
  pTVar8 = v3.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_90._0_4_ = 1;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((v3.
         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         ._M_impl.super__Vector_impl_data._M_start)->copies == 1);
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&(v3.
                  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  ._M_impl.super__Vector_impl_data._M_start)->copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)&v5;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_90;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = &v6;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73625,(size_t)&v4,0x60a,&local_b0,
             "1",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x60b;
  file_12.m_begin = (iterator)&local_378;
  msg_12.m_end = pvVar7;
  msg_12.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_388,
             msg_12);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_90._0_8_ = (ulong)(uint)local_90._4_4_ << 0x20;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[1].copies == 0);
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&pTVar8[1].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)&v5;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_90;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = &v6;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73632,(size_t)&v4,0x60b,&local_b0,
             "0",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  pTVar8 = v3.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(&v4,3);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker>(&v4,pTVar8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker&>
            ((vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
              *)&v4,pTVar8 + 1);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker>(&v4,&t3);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x60e;
  file_13.m_begin = (iterator)&local_3b8;
  msg_13.m_end = pvVar7;
  msg_13.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3c8,
             msg_13);
  pTVar8 = v4.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_b8 = (undefined1  [8])
             ((long)v4.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)v4.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_90._0_8_ = local_e0;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)v4.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)v4.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x30);
  local_e0._0_4_ = 3;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_empty = false;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)&v6;
  local_d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_90;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf7363f,(size_t)&v5,0x60e,&local_b0,
             "3U",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74eff1;
  file_14.m_end = (iterator)0x60f;
  file_14.m_begin = (iterator)&local_3d8;
  msg_14.m_end = pvVar7;
  msg_14.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3e8,
             msg_14);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v4[0].origin == &t1";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3f0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar8->origin == &t1);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_3f8,0x60f);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74f0c3;
  file_15.m_end = (iterator)0x610;
  file_15.m_begin = (iterator)&local_408;
  msg_15.m_end = pvVar7;
  msg_15.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_418,
             msg_15);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[1].origin == &t2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v4[1].origin == &t2";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_420 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_428,0x610);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74f195;
  file_16.m_end = (iterator)0x611;
  file_16.m_begin = (iterator)&local_438;
  msg_16.m_end = pvVar7;
  msg_16.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_448,
             msg_16);
  pTVar8 = v4.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (v4.
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        ._M_impl.super__Vector_impl_data._M_start[2].origin == &t3);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v4[2].origin == &t3";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_450 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_458,0x611);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x612;
  file_17.m_begin = (iterator)&local_468;
  msg_17.m_end = pvVar7;
  msg_17.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_478,
             msg_17);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_b8._0_4_ = 1;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8->copies == 1);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&pTVar8->copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)&v6;
  local_90._0_8_ = local_b8;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_90;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73685,(size_t)&v5,0x612,&local_b0,
             "1",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x613;
  file_18.m_begin = (iterator)&local_488;
  msg_18.m_end = pvVar7;
  msg_18.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_498,
             msg_18);
  pTVar8 = v4.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_b8._0_4_ = 1;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (v4.
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        ._M_impl.super__Vector_impl_data._M_start[1].copies == 1);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&v4.
                 super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)&v6;
  local_90._0_8_ = local_b8;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_90;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73692,(size_t)&v5,0x613,&local_b0,
             "1",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x614;
  file_19.m_begin = (iterator)&local_4a8;
  msg_19.m_end = pvVar7;
  msg_19.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4b8,
             msg_19);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_b8 = (undefined1  [8])((ulong)(uint)local_b8._4_4_ << 0x20);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[2].copies == 0);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&pTVar8[2].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)&v6;
  local_90._0_8_ = local_b8;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_90;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf7369f,(size_t)&v5,0x614,&local_b0,
             "0",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::vector(&local_4e8,&v1);
  Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            (&v5,&local_4e8,&v4);
  if (local_4e8.
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4e8.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4e8.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e8.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x617;
  file_20.m_begin = (iterator)&local_4f8;
  msg_20.m_end = pvVar7;
  msg_20.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_508,
             msg_20);
  pTVar8 = v5.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_e0 = (undefined1  [8])
             ((long)v5.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)v5.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_b8 = (undefined1  [8])(local_6a4 + 4);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)v5.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)v5.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40);
  local_6a4._4_4_ = 4;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_empty = false;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_90._0_8_ = local_e0;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_90;
  local_d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_b8;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf736ac,(size_t)&v6,0x617,&local_b0,
             "4U",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74f82e;
  file_21.m_end = (iterator)0x618;
  file_21.m_begin = (iterator)&local_518;
  msg_21.m_end = pvVar7;
  msg_21.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_528,
             msg_21);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v5[0].origin == &t1";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_530 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar8->origin == &t1);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_538,0x618);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74f900;
  file_22.m_end = (iterator)0x619;
  file_22.m_begin = (iterator)&local_548;
  msg_22.m_end = pvVar7;
  msg_22.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_558,
             msg_22);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[1].origin == &t1);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v5[1].origin == &t1";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_560 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_568,0x619);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74f9d2;
  file_23.m_end = (iterator)0x61a;
  file_23.m_begin = (iterator)&local_578;
  msg_23.m_end = pvVar7;
  msg_23.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_588,
             msg_23);
  pTVar8 = v5.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (v5.
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        ._M_impl.super__Vector_impl_data._M_start[2].origin == &t2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v5[2].origin == &t2";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_590 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_598,0x61a);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x74faac;
  file_24.m_end = (iterator)0x61b;
  file_24.m_begin = (iterator)&local_5a8;
  msg_24.m_end = pvVar7;
  msg_24.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_5b8,
             msg_24);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar8[3].origin == &t3);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v5[3].origin == &t3";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5c0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_5c8,0x61b);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x61c;
  file_25.m_begin = (iterator)&local_5d8;
  msg_25.m_end = pvVar7;
  msg_25.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_5e8,
             msg_25);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_e0._0_4_ = 2;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8->copies == 2);
  local_90._0_8_ = &pTVar8->copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_90;
  local_b8 = (undefined1  [8])local_e0;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_b8;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73706,(size_t)&v6,0x61c,&local_b0,
             "2",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x61d;
  file_26.m_begin = (iterator)&local_5f8;
  msg_26.m_end = pvVar7;
  msg_26.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_608,
             msg_26);
  pTVar8 = v5.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_e0._0_4_ = 2;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (v5.
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        ._M_impl.super__Vector_impl_data._M_start[1].copies == 2);
  local_90._0_8_ =
       &v5.
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        ._M_impl.super__Vector_impl_data._M_start[1].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_90;
  local_b8 = (undefined1  [8])local_e0;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_b8;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73713,(size_t)&v6,0x61d,&local_b0,
             "2",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x61e;
  file_27.m_begin = (iterator)&local_618;
  msg_27.m_end = pvVar7;
  msg_27.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_628,
             msg_27);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_e0._0_4_ = 2;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[2].copies == 2);
  local_90._0_8_ = &pTVar8[2].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_90;
  local_b8 = (undefined1  [8])local_e0;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_b8;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73720,(size_t)&v6,0x61e,&local_b0,
             "2",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x61f;
  file_28.m_begin = (iterator)&local_638;
  msg_28.m_end = pvVar7;
  msg_28.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_648,
             msg_28);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_e0._0_4_ = 1;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (v5.
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        ._M_impl.super__Vector_impl_data._M_start[3].copies == 1);
  local_90._0_8_ =
       &v5.
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        ._M_impl.super__Vector_impl_data._M_start[3].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1c4fcd2;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6c42b;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_90;
  local_b8 = (undefined1  [8])local_e0;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_b8;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf7372d,(size_t)&v6,0x61f,&local_b0,
             "1",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_678.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       v1.
       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_678.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       v1.
       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_678.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       v1.
       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            (&v6,&local_678,&v3);
  if (local_678.
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_678.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_678.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_678.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x622;
  file_29.m_begin = (iterator)&local_688;
  msg_29.m_end = pvVar7;
  msg_29.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_698,
             msg_29);
  pTVar8 = v6.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  register0x00000010 =
       (long)v6.
             super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)v6.
             super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_e0 = (undefined1  [8])local_6a4;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)v6.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)v6.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x30);
  local_6a4._0_4_ = 3;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_empty = false;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b8 = (undefined1  [8])(local_6a4 + 4);
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf7373a,(size_t)local_90,0x622,
             &local_b0,"3U",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x7502ab;
  file_30.m_end = (iterator)0x623;
  file_30.m_begin = (iterator)&local_6b8;
  msg_30.m_end = pvVar7;
  msg_30.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_6c8,
             msg_30);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v6[0].origin == &t1";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6d0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar8->origin == &t1);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_6d8,0x623);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x75037d;
  file_31.m_end = (iterator)0x624;
  file_31.m_begin = (iterator)&local_6e8;
  msg_31.m_end = pvVar7;
  msg_31.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_6f8,
             msg_31);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[1].origin == &t1);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v6[1].origin == &t1";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_700 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_708,0x624);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x75044f;
  file_32.m_end = (iterator)0x625;
  file_32.m_begin = (iterator)&local_718;
  msg_32.m_end = pvVar7;
  msg_32.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_728,
             msg_32);
  pTVar8 = v6.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (v6.
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        ._M_impl.super__Vector_impl_data._M_start[2].origin == &t2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v6[2].origin == &t2";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_738 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_730 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_738,0x625);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x626;
  file_33.m_begin = (iterator)&local_748;
  msg_33.m_end = pvVar7;
  msg_33.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_758,
             msg_33);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_6a4._4_4_ = 1;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8->copies == 1);
  local_b8 = (undefined1  [8])&pTVar8->copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_e0 = (undefined1  [8])(local_6a4 + 4);
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73780,(size_t)local_90,0x626,
             &local_b0,"1",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x627;
  file_34.m_begin = (iterator)&local_768;
  msg_34.m_end = pvVar7;
  msg_34.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_778,
             msg_34);
  pTVar8 = v6.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_6a4._4_4_ = 2;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (v6.
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        ._M_impl.super__Vector_impl_data._M_start[1].copies == 2);
  local_b8 = (undefined1  [8])
             &v6.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_start[1].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_e0 = (undefined1  [8])(local_6a4 + 4);
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf7378d,(size_t)local_90,0x627,
             &local_b0,"2",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x628;
  file_35.m_begin = (iterator)&local_788;
  msg_35.m_end = pvVar7;
  msg_35.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_798,
             msg_35);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_6a4._4_4_ = 1;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[2].copies == 1);
  local_b8 = (undefined1  [8])&pTVar8[2].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_e0 = (undefined1  [8])(local_6a4 + 4);
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf7379a,(size_t)local_90,0x628,
             &local_b0,"1",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::vector(&local_7b8,&v2);
  pTVar9 = v4.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar8 = v4.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(&local_7b8,
            ((long)v4.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)v4.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) +
            ((long)local_7b8.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_7b8.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  if (pTVar8 != pTVar9) {
    do {
      std::
      vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      ::emplace_back<util_tests::(anonymous_namespace)::Tracker>(&local_7b8,pTVar8);
      pTVar8 = pTVar8 + 1;
    } while (pTVar8 != pTVar9);
  }
  pTVar4 = local_7b8.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pTVar9 = local_7b8.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar8 = local_7b8.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_7b8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7b8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7b8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x62b;
  file_36.m_begin = (iterator)&local_7c8;
  msg_36.m_end = pvVar7;
  msg_36.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_7d8,
             msg_36);
  register0x00000008 = (long)pTVar9 - (long)pTVar8 >> 4;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)pTVar9 - (long)pTVar8 == 0x40);
  local_1b0 = "";
  local_6a4._0_4_ = 4;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_empty = false;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b8 = (undefined1  [8])(local_6a4 + 4);
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_e0 = (undefined1  [8])local_6a4;
  local_d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf737a7,(size_t)local_90,0x62b,
             &local_b0,"4U",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x750b33;
  file_37.m_end = (iterator)0x62c;
  file_37.m_begin = (iterator)&local_7e8;
  msg_37.m_end = pvVar7;
  msg_37.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_7f8,
             msg_37);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v7[0].origin == &t2";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_808 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_800 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar8->origin == &t2);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_808,0x62c);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_810 = "";
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x750c0c;
  file_38.m_end = (iterator)0x62d;
  file_38.m_begin = (iterator)&local_818;
  msg_38.m_end = pvVar7;
  msg_38.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_828,
             msg_38);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[1].origin == &t1);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v7[1].origin == &t1";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_830 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_838,0x62d);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_848 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_840 = "";
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x750ce3;
  file_39.m_end = (iterator)0x62e;
  file_39.m_begin = (iterator)&local_848;
  msg_39.m_end = pvVar7;
  msg_39.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_858,
             msg_39);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[2].origin == &t2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v7[2].origin == &t2";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_860 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_868,0x62e);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_878 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_870 = "";
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x750dba;
  file_40.m_end = (iterator)0x62f;
  file_40.m_begin = (iterator)&local_878;
  msg_40.m_end = pvVar7;
  msg_40.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_888,
             msg_40);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar8[3].origin == &t3);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v7[3].origin == &t3";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_898 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_890 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_898,0x62f);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_8a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8a0 = "";
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x630;
  file_41.m_begin = (iterator)&local_8a8;
  msg_41.m_end = pvVar7;
  msg_41.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_8b8,
             msg_41);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_6a4._4_4_ = 1;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8->copies == 1);
  local_b8 = (undefined1  [8])&pTVar8->copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_e0 = (undefined1  [8])(local_6a4 + 4);
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73801,(size_t)local_90,0x630,
             &local_b0,"1",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_8c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8c0 = "";
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x631;
  file_42.m_begin = (iterator)&local_8c8;
  msg_42.m_end = pvVar7;
  msg_42.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_8d8,
             msg_42);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_6a4._4_4_ = 1;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[1].copies == 1);
  local_b8 = (undefined1  [8])&pTVar8[1].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_e0 = (undefined1  [8])(local_6a4 + 4);
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf7380e,(size_t)local_90,0x631,
             &local_b0,"1",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_8e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8e0 = "";
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x632;
  file_43.m_begin = (iterator)&local_8e8;
  msg_43.m_end = pvVar7;
  msg_43.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_8f8,
             msg_43);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_6a4._4_4_ = 1;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[2].copies == 1);
  local_b8 = (undefined1  [8])&pTVar8[2].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_e0 = (undefined1  [8])(local_6a4 + 4);
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf7381b,(size_t)local_90,0x632,
             &local_b0,"1",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_908 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_900 = "";
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x633;
  file_44.m_begin = (iterator)&local_908;
  msg_44.m_end = pvVar7;
  msg_44.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_918,
             msg_44);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  stack0xfffffffffffff960 = (ulong)uStack_69c << 0x20;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar8[3].copies == 0);
  local_b8 = (undefined1  [8])&pTVar8[3].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_e0 = (undefined1  [8])(local_6a4 + 4);
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73828,(size_t)local_90,0x633,
             &local_b0,"0",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  pTVar5 = v2.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar3 = v2.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = v3.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar9 = v3.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_938.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       v2.
       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_938.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       v2.
       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_938.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       v2.
       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(&local_938,
            ((long)v3.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)v3.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) +
            ((long)pTVar5 - (long)pTVar3 >> 4));
  if (pTVar9 != pTVar2) {
    do {
      std::
      vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      ::emplace_back<util_tests::(anonymous_namespace)::Tracker>(&local_938,pTVar9);
      pTVar9 = pTVar9 + 1;
    } while (pTVar9 != pTVar2);
  }
  pTVar3 = local_938.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pTVar2 = local_938.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar9 = local_938.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_938.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_938.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_938.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_948 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_940 = "";
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x636;
  file_45.m_begin = (iterator)&local_948;
  msg_45.m_end = pvVar7;
  msg_45.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_958,
             msg_45);
  register0x00000000 = (long)pTVar2 - (long)pTVar9 >> 4;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)pTVar2 - (long)pTVar9 == 0x30);
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
  local_e0 = (undefined1  [8])local_6a4;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_1b0 = "";
  local_6a4._0_4_ = 3;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b8 = (undefined1  [8])(local_6a4 + 4);
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73835,(size_t)local_90,0x636,
             &local_b0,"3U",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_968 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_960 = "";
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x751607;
  file_46.m_end = (iterator)0x637;
  file_46.m_begin = (iterator)&local_968;
  msg_46.m_end = pvVar7;
  msg_46.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_978,
             msg_46);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v8[0].origin == &t2";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_988 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_980 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar9->origin == &t2);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_988,0x637);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_998 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_990 = "";
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x7516d8;
  file_47.m_end = (iterator)0x638;
  file_47.m_begin = (iterator)&local_998;
  msg_47.m_end = pvVar7;
  msg_47.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_9a8,
             msg_47);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar9[1].origin == &t1);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v8[1].origin == &t1";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_9b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9b0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_9b8,0x638);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_9c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9c0 = "";
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x7517aa;
  file_48.m_end = (iterator)0x639;
  file_48.m_begin = (iterator)&local_9c8;
  msg_48.m_end = pvVar7;
  msg_48.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_9d8,
             msg_48);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar9[2].origin == &t2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "v8[2].origin == &t2";
  local_1c8._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_9e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9e0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_98 = (lazy_ostream *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,&local_b0,1,0,WARN,_cVar10,(size_t)&local_9e8,0x639);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_9f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9f0 = "";
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0x63a;
  file_49.m_begin = (iterator)&local_9f8;
  msg_49.m_end = pvVar7;
  msg_49.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_a08,
             msg_49);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  stack0xfffffffffffff960 = stack0xfffffffffffff960 & 0xffffffff00000000;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar9->copies == 0);
  local_b8 = (undefined1  [8])&pTVar9->copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_e0 = (undefined1  [8])(local_6a4 + 4);
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf7387b,(size_t)local_90,0x63a,
             &local_b0,"0",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_a18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a10 = "";
  local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  file_50.m_end = (iterator)0x63b;
  file_50.m_begin = (iterator)&local_a18;
  msg_50.m_end = pvVar7;
  msg_50.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_a28,
             msg_50);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_6a4._4_4_ = 1;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar9[1].copies == 1);
  local_b8 = (undefined1  [8])&pTVar9[1].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_e0 = (undefined1  [8])(local_6a4 + 4);
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73888,(size_t)local_90,0x63b,
             &local_b0,"1",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_a38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a30 = "";
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0x63c;
  file_51.m_begin = (iterator)&local_a38;
  msg_51.m_end = pvVar7;
  msg_51.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_a48,
             msg_51);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  stack0xfffffffffffff960 = (ulong)uStack_69c << 0x20;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar9[2].copies == 0);
  local_b8 = (undefined1  [8])&pTVar9[2].copies;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90._8_8_ = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = (lazy_ostream *)local_b8;
  local_e0 = (undefined1  [8])(local_6a4 + 4);
  local_d8.m_message.px = (element_type *)((ulong)local_d8.m_message.px & 0xffffffffffffff00);
  local_d8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf73895,(size_t)local_90,0x63c,
             &local_b0,"0",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  operator_delete(pTVar9,(long)pTVar3 - (long)pTVar9);
  operator_delete(pTVar8,(long)pTVar4 - (long)pTVar8);
  if (v6.
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(v6.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)v6.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)v6.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (v5.
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(v5.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)v5.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)v5.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (v4.
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(v4.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)v4.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)v4.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (v3.
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(v3.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)v3.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)v3.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (v2.
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(v2.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)v2.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)v2.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (v1.
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(v1.
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)v1.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)v1.
                          super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_tracked_vector)
{
    Tracker t1;
    Tracker t2;
    Tracker t3;

    BOOST_CHECK(t1.origin == &t1);
    BOOST_CHECK(t2.origin == &t2);
    BOOST_CHECK(t3.origin == &t3);

    auto v1 = Vector(t1);
    BOOST_CHECK_EQUAL(v1.size(), 1U);
    BOOST_CHECK(v1[0].origin == &t1);
    BOOST_CHECK_EQUAL(v1[0].copies, 1);

    auto v2 = Vector(std::move(t2));
    BOOST_CHECK_EQUAL(v2.size(), 1U);
    BOOST_CHECK(v2[0].origin == &t2); // NOLINT(*-use-after-move)
    BOOST_CHECK_EQUAL(v2[0].copies, 0);

    auto v3 = Vector(t1, std::move(t2));
    BOOST_CHECK_EQUAL(v3.size(), 2U);
    BOOST_CHECK(v3[0].origin == &t1);
    BOOST_CHECK(v3[1].origin == &t2); // NOLINT(*-use-after-move)
    BOOST_CHECK_EQUAL(v3[0].copies, 1);
    BOOST_CHECK_EQUAL(v3[1].copies, 0);

    auto v4 = Vector(std::move(v3[0]), v3[1], std::move(t3));
    BOOST_CHECK_EQUAL(v4.size(), 3U);
    BOOST_CHECK(v4[0].origin == &t1);
    BOOST_CHECK(v4[1].origin == &t2);
    BOOST_CHECK(v4[2].origin == &t3); // NOLINT(*-use-after-move)
    BOOST_CHECK_EQUAL(v4[0].copies, 1);
    BOOST_CHECK_EQUAL(v4[1].copies, 1);
    BOOST_CHECK_EQUAL(v4[2].copies, 0);

    auto v5 = Cat(v1, v4);
    BOOST_CHECK_EQUAL(v5.size(), 4U);
    BOOST_CHECK(v5[0].origin == &t1);
    BOOST_CHECK(v5[1].origin == &t1);
    BOOST_CHECK(v5[2].origin == &t2);
    BOOST_CHECK(v5[3].origin == &t3);
    BOOST_CHECK_EQUAL(v5[0].copies, 2);
    BOOST_CHECK_EQUAL(v5[1].copies, 2);
    BOOST_CHECK_EQUAL(v5[2].copies, 2);
    BOOST_CHECK_EQUAL(v5[3].copies, 1);

    auto v6 = Cat(std::move(v1), v3);
    BOOST_CHECK_EQUAL(v6.size(), 3U);
    BOOST_CHECK(v6[0].origin == &t1);
    BOOST_CHECK(v6[1].origin == &t1);
    BOOST_CHECK(v6[2].origin == &t2);
    BOOST_CHECK_EQUAL(v6[0].copies, 1);
    BOOST_CHECK_EQUAL(v6[1].copies, 2);
    BOOST_CHECK_EQUAL(v6[2].copies, 1);

    auto v7 = Cat(v2, std::move(v4));
    BOOST_CHECK_EQUAL(v7.size(), 4U);
    BOOST_CHECK(v7[0].origin == &t2);
    BOOST_CHECK(v7[1].origin == &t1);
    BOOST_CHECK(v7[2].origin == &t2);
    BOOST_CHECK(v7[3].origin == &t3);
    BOOST_CHECK_EQUAL(v7[0].copies, 1);
    BOOST_CHECK_EQUAL(v7[1].copies, 1);
    BOOST_CHECK_EQUAL(v7[2].copies, 1);
    BOOST_CHECK_EQUAL(v7[3].copies, 0);

    auto v8 = Cat(std::move(v2), std::move(v3));
    BOOST_CHECK_EQUAL(v8.size(), 3U);
    BOOST_CHECK(v8[0].origin == &t2);
    BOOST_CHECK(v8[1].origin == &t1);
    BOOST_CHECK(v8[2].origin == &t2);
    BOOST_CHECK_EQUAL(v8[0].copies, 0);
    BOOST_CHECK_EQUAL(v8[1].copies, 1);
    BOOST_CHECK_EQUAL(v8[2].copies, 0);
}